

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

bool __thiscall
DNSResolve::DecodeDotStr
          (DNSResolve *this,char *encoded_str,uint16_t *encoded_str_len,char *dot_str,
          uint16_t dot_str_size,char *packet_start_pos)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t local_50;
  ushort local_4e;
  byte local_4b;
  ushort local_4a;
  uint16_t encode_str_len;
  uint16_t jump_pos;
  uint8_t label_data_len;
  uint16_t plain_str_len;
  char *decode_pos;
  char *packet_start_pos_local;
  char *pcStack_30;
  uint16_t dot_str_size_local;
  char *dot_str_local;
  uint16_t *encoded_str_len_local;
  char *encoded_str_local;
  DNSResolve *this_local;
  
  if (((encoded_str == (char *)0x0) || (encoded_str_len == (uint16_t *)0x0)) ||
     (dot_str == (char *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    local_4a = 0;
    *encoded_str_len = 0;
    _encode_str_len = (uint16_t *)encoded_str;
    decode_pos = packet_start_pos;
    packet_start_pos_local._6_2_ = dot_str_size;
    pcStack_30 = dot_str;
    dot_str_local = (char *)encoded_str_len;
    encoded_str_len_local = (uint16_t *)encoded_str;
    encoded_str_local = (char *)this;
    while (local_4b = (byte)*_encode_str_len, local_4b != 0) {
      if ((local_4b & 0xc0) != 0) {
        if (decode_pos == (char *)0x0) {
          return false;
        }
        uVar2 = ntohs(*_encode_str_len);
        local_4e = uVar2 & 0x3fff;
        local_50 = 0;
        bVar1 = DecodeDotStr(this,decode_pos + (int)(uint)local_4e,&local_50,
                             pcStack_30 + (int)(uint)local_4a,
                             packet_start_pos_local._6_2_ - local_4a,decode_pos);
        if (!bVar1) {
          return false;
        }
        *(short *)dot_str_local = *(short *)dot_str_local + 2;
        return true;
      }
      if ((uint)packet_start_pos_local._6_2_ < (uint)local_4a + (uint)local_4b + 1) {
        return false;
      }
      memcpy(pcStack_30 + (int)(uint)local_4a,(byte *)((long)_encode_str_len + 1),(ulong)local_4b);
      pcStack_30[(long)(int)(uint)local_4b + (long)(int)(uint)local_4a] = '.';
      _encode_str_len = (uint16_t *)((long)_encode_str_len + (long)(int)(local_4b + 1));
      local_4a = local_4a + local_4b + 1;
      *(ushort *)dot_str_local = *(short *)dot_str_local + local_4b + 1;
    }
    pcStack_30[(int)(local_4a - 1)] = '\0';
    *(short *)dot_str_local = *(short *)dot_str_local + 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DNSResolve::DecodeDotStr(
    char *encoded_str,
    uint16_t *encoded_str_len,
    char *dot_str,
    uint16_t dot_str_size,
    char *packet_start_pos)
{
    if (encoded_str == NULL || encoded_str_len == NULL || dot_str == NULL)
    {
        return false;
    }

    char *decode_pos = encoded_str;
    uint16_t plain_str_len = 0;
    uint8_t label_data_len = 0;
    *encoded_str_len = 0;

    while ((label_data_len = *decode_pos) != 0x00)
    {
        if ((label_data_len & 0xc0) == 0)   //normal mode��LabelDataLen + Label
        {
            if (plain_str_len + label_data_len + 1 > dot_str_size)
            {
                return false;
            }
            memcpy(dot_str + plain_str_len, decode_pos + 1, label_data_len);
            memcpy(dot_str + plain_str_len + label_data_len, ".", 1);
            decode_pos += (label_data_len + 1);
            plain_str_len += (label_data_len + 1);
            *encoded_str_len += (label_data_len + 1);
        }
        else
        {
            //compression scheme��11000000 00000000��
            //first two bits are ones��next is OFFSET field
            if (packet_start_pos == NULL)
            {
                return false;
            }
            uint16_t jump_pos = ntohs(*(uint16_t*)(decode_pos)) & 0x3fff;
            uint16_t encode_str_len = 0;
            if (!DecodeDotStr(packet_start_pos + jump_pos, &encode_str_len,
                              dot_str + plain_str_len, dot_str_size - plain_str_len,
                              packet_start_pos))
            {
                return false;
            }
            else
            {
                *encoded_str_len += 2;
                return true;
            }
        }
    }

    dot_str[plain_str_len - 1] = '\0';
    *encoded_str_len += 1;

    return true;
}